

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestReadSome(void)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  long lVar4;
  const_string *file;
  iterator line_num;
  const_string *msg;
  void *this;
  size_t in;
  size_t bytesAvail;
  char datain [5000];
  istream is;
  int i;
  ostream os;
  string junk;
  lazy_ostream *in_stack_ffffffffffffe7c8;
  basic_cstring<const_char> *in_stack_ffffffffffffe7d0;
  lazy_ostream *in_stack_ffffffffffffe7d8;
  begin *in_stack_ffffffffffffe7e0;
  size_t in_stack_ffffffffffffe7f8;
  begin *in_stack_ffffffffffffe838;
  unit_test_log_t *in_stack_ffffffffffffe840;
  basic_cstring<const_char> local_1770;
  undefined1 local_1760 [56];
  basic_cstring<const_char> local_1728;
  basic_cstring<const_char> local_1718;
  undefined1 local_1708 [5008];
  char local_378 [404];
  int local_1e4;
  ostream local_1e0;
  string local_80 [80];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            (in_stack_ffffffffffffe7e0,(const_string *)in_stack_ffffffffffffe7d8,
             (size_t)in_stack_ffffffffffffe7d0);
  boost::unit_test::unit_test_log_t::operator<<(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838)
  ;
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_ffffffffffffe7d8,
             (log_level)((ulong)in_stack_ffffffffffffe7d0 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<(in_stack_ffffffffffffe7d8,(char (*) [13])in_stack_ffffffffffffe7d0);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]> *)
             0x232de4);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_ffffffffffffe7d0);
  makeString_abi_cxx11_(in_stack_ffffffffffffe7f8);
  avro::ostream::ostream((ostream *)in_stack_ffffffffffffe7e0);
  for (local_1e4 = 0; local_1e4 < 5; local_1e4 = local_1e4 + 1) {
    std::operator<<(&local_1e0,local_80);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Buffer has ");
  avro::ostream::getBuffer((ostream *)0x232efc);
  sVar3 = avro::OutputBuffer::size((OutputBuffer *)0x232f13);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2," bytes\n");
  avro::ostream::getBuffer((ostream *)0x232f5f);
  avro::istream::istream
            ((istream *)in_stack_ffffffffffffe7e0,(OutputBuffer *)in_stack_ffffffffffffe7d8);
  while( true ) {
    std::ios::rdbuf();
    lVar4 = std::streambuf::in_avail();
    if (lVar4 == 0) break;
    std::ios::rdbuf();
    local_1718.m_end = (iterator)std::streambuf::in_avail();
    poVar2 = std::operator<<((ostream *)&std::cout,"Bytes avail = ");
    file = (const_string *)std::ostream::operator<<(poVar2,(ulong)local_1718.m_end);
    std::ostream::operator<<(file,std::endl<char,std::char_traits<char>>);
    line_num = (iterator)std::istream::readsome(local_378,(long)local_1708);
    local_1718.m_begin = line_num;
    msg = (const_string *)std::operator<<((ostream *)&std::cout,"Bytes read = ");
    this = (void *)std::ostream::operator<<(msg,(ulong)local_1718.m_begin);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1728,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe7d0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)poVar2,file,(size_t)line_num,msg);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffe7d8,(char (*) [1])in_stack_ffffffffffffe7d0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1770,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      in_stack_ffffffffffffe7d8 = (lazy_ostream *)0x2d682a;
      in_stack_ffffffffffffe7d0 = &local_1718;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_1760,&local_1770,0x20f,1,2,&local_1718.m_end,"bytesAvail");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x2331b5);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  avro::istream::~istream((istream *)in_stack_ffffffffffffe7d0);
  avro::ostream::~ostream((ostream *)in_stack_ffffffffffffe7d0);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void TestReadSome()
{
    BOOST_TEST_MESSAGE( "TestReadSome");
    {
        std::string junk = makeString(kDefaultBlockSize/2);

        ostream os;

        // write enough bytes to a buffer, to create at least 3 blocks
        int i = 0;
        for(; i < 5; ++i) {
            os << junk;
        }

        cout << "Buffer has " << os.getBuffer().size() << " bytes\n";

        istream is(os.getBuffer());

        char datain[5000];

        while(is.rdbuf()->in_avail()) {
            size_t bytesAvail = static_cast<size_t>(is.rdbuf()->in_avail());
            cout << "Bytes avail = " << bytesAvail << endl;
            size_t in = static_cast<size_t>(is.readsome(datain, sizeof(datain)));
            cout << "Bytes read = " << in << endl;
            BOOST_CHECK_EQUAL(bytesAvail, in);
        }
    }
}